

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool AppInitParameterInteraction(ArgsManager *args)

{
  Span<const_unsigned_char> s;
  ConstevalFormatString<1U> fmt;
  ConstevalFormatString<0U> fmt_00;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  unsigned_long uVar1;
  bool bVar2;
  byte bVar3;
  ChainType CVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  int64_t iVar8;
  size_type sVar9;
  size_type sVar10;
  size_t sVar11;
  unsigned_long *puVar12;
  int *piVar13;
  Options *opts;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffe818;
  undefined4 in_stack_ffffffffffffe81c;
  char *in_stack_ffffffffffffe820;
  bilingual_str *in_stack_ffffffffffffe828;
  bilingual_str *in_stack_ffffffffffffe830;
  string *in_stack_ffffffffffffe838;
  undefined5 in_stack_ffffffffffffe840;
  undefined1 in_stack_ffffffffffffe845;
  undefined1 in_stack_ffffffffffffe846;
  undefined1 in_stack_ffffffffffffe847;
  anon_class_8_1_64ee79b3_for__M_pred in_stack_ffffffffffffe848;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe850;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffe858;
  char *in_stack_ffffffffffffe860;
  ConstevalStringLiteral in_stack_ffffffffffffe868;
  ConstevalStringLiteral str;
  undefined7 in_stack_ffffffffffffe870;
  undefined1 in_stack_ffffffffffffe877;
  bilingual_str *in_stack_ffffffffffffe878;
  undefined4 in_stack_ffffffffffffe880;
  undefined4 in_stack_ffffffffffffe884;
  ArgsManager *in_stack_ffffffffffffe888;
  ArgsManager *this;
  ArgsManager *in_stack_ffffffffffffe890;
  ArgsManager *this_00;
  undefined7 in_stack_ffffffffffffe898;
  undefined1 in_stack_ffffffffffffe89f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8a0;
  ArgsManager *in_stack_ffffffffffffe8a8;
  ArgsManager *args_00;
  undefined7 in_stack_ffffffffffffe8c8;
  undefined1 in_stack_ffffffffffffe8cf;
  string *in_stack_ffffffffffffe8d0;
  char *in_stack_ffffffffffffe8d8;
  undefined8 in_stack_ffffffffffffe8e0;
  undefined7 in_stack_ffffffffffffe8e8;
  undefined1 in_stack_ffffffffffffe8ef;
  ArgsManager *in_stack_ffffffffffffe928;
  ArgsManager *in_stack_ffffffffffffe930;
  undefined7 in_stack_ffffffffffffe9a0;
  undefined1 in_stack_ffffffffffffe9a7;
  undefined4 in_stack_ffffffffffffe9ac;
  Level level;
  undefined8 in_stack_ffffffffffffe9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9d0;
  bool local_15f2;
  byte local_15a9;
  byte local_1562;
  string *option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int nBind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  SectionInfo *section;
  list<SectionInfo,_std::allocator<SectionInfo>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ChainType chain;
  CChainParams *chainparams;
  ArgsManager *args_local;
  byte local_1311;
  Notifications notifications;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  const_iterator __end2;
  const_iterator __begin2;
  undefined1 local_12e1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  allocator<char> local_12c6;
  undefined1 local_12c5 [2];
  allocator<char> local_12c3;
  allocator<char> local_12c2;
  allocator<char> local_12c1;
  allocator<char> local_12c0;
  allocator<char> local_12bf;
  allocator<char> local_12be;
  allocator<char> local_12bd;
  allocator<char> local_12bc;
  allocator<char> local_12bb;
  allocator<char> local_12ba;
  allocator<char> local_12b9 [5];
  int min_required_fds;
  allocator<char> local_12ae;
  allocator<char> local_12ad;
  int user_max_connection;
  undefined8 local_12a8;
  allocator<char> local_129e;
  allocator<char> local_129d;
  allocator<char> local_129c;
  allocator<char> local_129b;
  allocator<char> local_129a;
  allocator<char> local_1299 [32];
  allocator<char> local_1279 [25];
  size_t nUserBind;
  allocator<char> local_1251;
  allocator<char> local_1250;
  allocator<char> local_124f;
  allocator<char> local_124e;
  allocator<char> local_124d;
  undefined1 local_124c;
  allocator<char> local_124b;
  allocator<char> local_124a;
  BlockFilterType filter_type;
  const_iterator __end3;
  const_iterator __begin3;
  allocator<char> local_1231;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  allocator<char> local_1216;
  allocator<char> local_1215;
  allocator<char> local_1214;
  allocator<char> local_1213;
  allocator<char> local_1212;
  allocator<char> local_1211;
  iterator __end1_1;
  iterator __begin1_1;
  allocator<char> local_11c1;
  iterator __end1;
  iterator __begin1;
  Result<void> blockman_result;
  Options blockman_opts_dummy;
  Result<void> chainman_result;
  Options chainman_opts_dummy;
  Result<void> result_1;
  Result<void> result;
  string blockfilterindex_value;
  bilingual_str warnings;
  bilingual_str errors;
  _Alloc_hider local_8;
  
  local_8._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  Params();
  CVar4 = ArgsManager::GetChainType((ArgsManager *)in_stack_ffffffffffffe850);
  if (CVar4 == SIGNET) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe838,
               (char *)in_stack_ffffffffffffe830);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe838,
               (char *)in_stack_ffffffffffffe830);
    CChainParams::MessageStart
              ((CChainParams *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    Span<unsigned_char_const>::Span<std::array<unsigned_char,4ul>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffe828,
               (array<unsigned_char,_4UL> *)in_stack_ffffffffffffe820,
               (type)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    in_stack_ffffffffffffe828 = (bilingual_str *)&stack0xffffffffffffffd8;
    s.m_size = (size_t)in_stack_ffffffffffffe8a8;
    s.m_data = (uchar *)in_stack_ffffffffffffe8a0;
    HexStr_abi_cxx11_(s);
    in_stack_ffffffffffffe820 = "Signet derived magic (message start): %s\n";
    in_stack_ffffffffffffe818 = 2;
    logging_function._M_str._0_7_ = in_stack_ffffffffffffe8e8;
    logging_function._M_len = in_stack_ffffffffffffe8e0;
    logging_function._M_str._7_1_ = in_stack_ffffffffffffe8ef;
    source_file._M_str = in_stack_ffffffffffffe8d8;
    source_file._M_len = (size_t)in_stack_ffffffffffffe8d0;
    fmt.fmt._7_1_ = in_stack_ffffffffffffe8cf;
    fmt.fmt._0_7_ = in_stack_ffffffffffffe8c8;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,(int)((ulong)in_stack_ffffffffffffe888 >> 0x20),
               CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880),
               (Level)in_stack_ffffffffffffe9c0,fmt,in_stack_ffffffffffffe9d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  }
  bilingual_str::bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  ArgsManager::GetUnsuitableSectionOnlyArgs_abi_cxx11_(in_stack_ffffffffffffe890);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffe820);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe820);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffe828,(_Self *)in_stack_ffffffffffffe820);
    level = (Level)in_stack_ffffffffffffe9c0;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    _(in_stack_ffffffffffffe868);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
               (allocator<char> *)in_stack_ffffffffffffe858._M_current);
    Untranslated((string *)in_stack_ffffffffffffe850);
    operator+(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
    ChainTypeToString_abi_cxx11_((ChainType)((ulong)in_stack_ffffffffffffe868.lit >> 0x20));
    ChainTypeToString_abi_cxx11_((ChainType)((ulong)in_stack_ffffffffffffe868.lit >> 0x20));
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((bilingual_str *)in_stack_ffffffffffffe8a8,in_stack_ffffffffffffe8a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe89f,in_stack_ffffffffffffe898),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe890);
    bilingual_str::operator+=(in_stack_ffffffffffffe828,(bilingual_str *)in_stack_ffffffffffffe820);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::~allocator(&local_11c1);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  bVar2 = bilingual_str::empty
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
  ;
  if (!bVar2) {
    local_1311 = InitError((bilingual_str *)
                           CONCAT17(in_stack_ffffffffffffe847,
                                    CONCAT16(in_stack_ffffffffffffe846,
                                             CONCAT15(in_stack_ffffffffffffe845,
                                                      in_stack_ffffffffffffe840))));
    goto LAB_0019326e;
  }
  if (CVar4 == TESTNET) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe838,
               (char *)in_stack_ffffffffffffe830);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe838,
               (char *)in_stack_ffffffffffffe830);
    in_stack_ffffffffffffe820 =
         "Warning: Support for testnet3 is deprecated and will be removed in an upcoming release. Consider switching to testnet4.\n"
    ;
    in_stack_ffffffffffffe818 = 2;
    logging_function_00._M_str._0_7_ = in_stack_ffffffffffffe8e8;
    logging_function_00._M_len = in_stack_ffffffffffffe8e0;
    logging_function_00._M_str._7_1_ = in_stack_ffffffffffffe8ef;
    source_file_00._M_str = in_stack_ffffffffffffe8d8;
    source_file_00._M_len = (size_t)in_stack_ffffffffffffe8d0;
    fmt_00.fmt._7_1_ = in_stack_ffffffffffffe8cf;
    fmt_00.fmt._0_7_ = in_stack_ffffffffffffe8c8;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,(int)((ulong)in_stack_ffffffffffffe888 >> 0x20),
               CONCAT44(in_stack_ffffffffffffe884,in_stack_ffffffffffffe880),level,fmt_00);
  }
  bilingual_str::bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  ArgsManager::GetUnrecognizedSections_abi_cxx11_(in_stack_ffffffffffffe8a8);
  std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::begin
            ((list<SectionInfo,_std::allocator<SectionInfo>_> *)in_stack_ffffffffffffe820);
  __end1_1 = std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::end
                       ((list<SectionInfo,_std::allocator<SectionInfo>_> *)in_stack_ffffffffffffe820
                       );
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffe828,
                                 (_Self *)in_stack_ffffffffffffe820), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_List_iterator<SectionInfo>::operator*
              ((_List_iterator<SectionInfo> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
               (allocator<char> *)in_stack_ffffffffffffe858._M_current);
    Untranslated((string *)in_stack_ffffffffffffe850);
    _(in_stack_ffffffffffffe868);
    operator+(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
               (allocator<char> *)in_stack_ffffffffffffe858._M_current);
    Untranslated((string *)in_stack_ffffffffffffe850);
    operator+(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
    tinyformat::format<std::__cxx11::string,int,std::__cxx11::string>
              ((bilingual_str *)in_stack_ffffffffffffe8a8,in_stack_ffffffffffffe8a0,
               (int *)CONCAT17(in_stack_ffffffffffffe89f,in_stack_ffffffffffffe898),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe890);
    bilingual_str::operator+=(in_stack_ffffffffffffe828,(bilingual_str *)in_stack_ffffffffffffe820);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::~allocator(&local_1212);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::~allocator(&local_1211);
    std::_List_iterator<SectionInfo>::operator++
              ((_List_iterator<SectionInfo> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  }
  std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::~list
            ((list<SectionInfo,_std::allocator<SectionInfo>_> *)
             CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  bVar2 = bilingual_str::empty
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
  ;
  if (!bVar2) {
    InitWarning((bilingual_str *)
                CONCAT17(in_stack_ffffffffffffe847,
                         CONCAT16(in_stack_ffffffffffffe846,
                                  CONCAT15(in_stack_ffffffffffffe845,in_stack_ffffffffffffe840))));
  }
  ArgsManager::GetBlocksDirPath(in_stack_ffffffffffffe888);
  bVar2 = std::filesystem::is_directory((path *)in_stack_ffffffffffffe828);
  fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
               (allocator<char> *)in_stack_ffffffffffffe858._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
               (allocator<char> *)in_stack_ffffffffffffe858._M_current);
    ArgsManager::GetArg((ArgsManager *)in_stack_ffffffffffffe858._M_current,
                        (string *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848.option);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::~allocator(&local_1216);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::~allocator(&local_1215);
    bVar2 = std::operator==(&in_stack_ffffffffffffe828->original,in_stack_ffffffffffffe820);
    if ((bVar2) ||
       (bVar2 = std::operator==(&in_stack_ffffffffffffe828->original,in_stack_ffffffffffffe820),
       bVar2)) {
      AllBlockFilterTypes();
      std::set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>::
      operator=((set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                 *)in_stack_ffffffffffffe828,
                (set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                 *)in_stack_ffffffffffffe820);
LAB_00190618:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                 (allocator<char> *)in_stack_ffffffffffffe858._M_current);
      bVar2 = ArgsManager::GetBoolArg
                        ((ArgsManager *)in_stack_ffffffffffffe820,
                         (string *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                         SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
      std::allocator<char>::~allocator(&local_124a);
      if (bVar2) {
        (anonymous_namespace)::nLocalServices = (anonymous_namespace)::nLocalServices | 0x800;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                 (allocator<char> *)in_stack_ffffffffffffe858._M_current);
      bVar2 = ArgsManager::GetBoolArg
                        ((ArgsManager *)in_stack_ffffffffffffe820,
                         (string *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                         SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
      std::allocator<char>::~allocator(&local_124b);
      if (bVar2) {
        local_124c = 0;
        sVar7 = std::
                set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>::
                count((set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                       *)in_stack_ffffffffffffe828,(key_type *)in_stack_ffffffffffffe820);
        if (sVar7 != 1) {
          _(in_stack_ffffffffffffe868);
          local_1311 = InitError((bilingual_str *)
                                 CONCAT17(in_stack_ffffffffffffe847,
                                          CONCAT16(in_stack_ffffffffffffe846,
                                                   CONCAT15(in_stack_ffffffffffffe845,
                                                            in_stack_ffffffffffffe840))));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
          ;
          goto LAB_00193232;
        }
        (anonymous_namespace)::nLocalServices = (anonymous_namespace)::nLocalServices | 0x40;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                 (allocator<char> *)in_stack_ffffffffffffe858._M_current);
      iVar8 = ArgsManager::GetIntArg
                        ((ArgsManager *)in_stack_ffffffffffffe820,
                         (string *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                         (int64_t)in_stack_ffffffffffffe828);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
      std::allocator<char>::~allocator(&local_124d);
      if (iVar8 == 0) {
LAB_00190c8e:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                   (allocator<char> *)in_stack_ffffffffffffe858._M_current);
        bVar2 = ArgsManager::GetBoolArg
                          ((ArgsManager *)in_stack_ffffffffffffe820,
                           (string *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                           SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
        local_1562 = 0;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
          bVar2 = ArgsManager::GetBoolArg
                            ((ArgsManager *)in_stack_ffffffffffffe820,
                             (string *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818)
                             ,SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
          local_1562 = bVar2 ^ 0xff;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
          std::allocator<char>::~allocator(&local_1251);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
        std::allocator<char>::~allocator(&local_1250);
        if ((local_1562 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
          ArgsManager::GetArgs(in_stack_ffffffffffffe890,(string *)in_stack_ffffffffffffe888);
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
          ArgsManager::GetArgs(in_stack_ffffffffffffe890,(string *)in_stack_ffffffffffffe888);
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
          sVar11 = sVar9 + sVar10;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe828);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
          std::allocator<char>::~allocator(local_1299);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe828);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
          std::allocator<char>::~allocator(local_1279);
          local_15a9 = 0;
          nUserBind = sVar11;
          if (sVar11 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                       (allocator<char> *)in_stack_ffffffffffffe858._M_current);
            bVar2 = ArgsManager::GetBoolArg
                              ((ArgsManager *)in_stack_ffffffffffffe820,
                               (string *)
                               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                               SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
            local_15a9 = bVar2 ^ 0xff;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
            std::allocator<char>::~allocator(&local_129a);
          }
          if ((local_15a9 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                       (allocator<char> *)in_stack_ffffffffffffe858._M_current);
            bVar2 = ArgsManager::GetBoolArg
                              ((ArgsManager *)in_stack_ffffffffffffe820,
                               (string *)
                               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                               SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
            local_15f2 = false;
            if (!bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                         (allocator<char> *)in_stack_ffffffffffffe858._M_current);
              local_15f2 = ArgsManager::GetBoolArg
                                     ((ArgsManager *)in_stack_ffffffffffffe820,
                                      (string *)
                                      CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                                      SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
              std::allocator<char>::~allocator(&local_129d);
            }
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
            std::allocator<char>::~allocator(&local_129c);
            if (local_15f2 == false) {
              local_12a8 = 1;
              puVar12 = std::max<unsigned_long>
                                  ((unsigned_long *)in_stack_ffffffffffffe820,
                                   (unsigned_long *)
                                   CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
              uVar1 = *puVar12;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                         (allocator<char> *)in_stack_ffffffffffffe858._M_current);
              iVar8 = ArgsManager::GetIntArg
                                ((ArgsManager *)in_stack_ffffffffffffe820,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                                 (int64_t)in_stack_ffffffffffffe828);
              iVar5 = (int)iVar8;
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
              std::allocator<char>::~allocator(&local_12ad);
              user_max_connection = iVar5;
              if (iVar5 < 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                           (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                Untranslated((string *)in_stack_ffffffffffffe850);
                local_1311 = InitError((bilingual_str *)
                                       CONCAT17(in_stack_ffffffffffffe847,
                                                CONCAT16(in_stack_ffffffffffffe846,
                                                         CONCAT15(in_stack_ffffffffffffe845,
                                                                  in_stack_ffffffffffffe840))));
                bilingual_str::~bilingual_str
                          ((bilingual_str *)
                           CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                std::allocator<char>::~allocator(&local_12ae);
              }
              else {
                min_required_fds = (int)uVar1 + 0x9f;
                (anonymous_namespace)::available_fds =
                     RaiseFileDescriptorLimit(in_stack_ffffffffffffe818);
                if ((anonymous_namespace)::available_fds < min_required_fds) {
                  _(in_stack_ffffffffffffe868);
                  tinyformat::format<int,int>
                            ((bilingual_str *)
                             CONCAT17(in_stack_ffffffffffffe89f,in_stack_ffffffffffffe898),
                             (int *)in_stack_ffffffffffffe890,(int *)in_stack_ffffffffffffe888);
                  local_1311 = InitError((bilingual_str *)
                                         CONCAT17(in_stack_ffffffffffffe847,
                                                  CONCAT16(in_stack_ffffffffffffe846,
                                                           CONCAT15(in_stack_ffffffffffffe845,
                                                                    in_stack_ffffffffffffe840))));
                  bilingual_str::~bilingual_str
                            ((bilingual_str *)
                             CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                  bilingual_str::~bilingual_str
                            ((bilingual_str *)
                             CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                }
                else {
                  local_12b9._1_4_ = (anonymous_namespace)::available_fds - min_required_fds;
                  iVar5 = (anonymous_namespace)::available_fds;
                  piVar13 = std::min<int>((int *)in_stack_ffffffffffffe820,
                                          (int *)CONCAT44(in_stack_ffffffffffffe81c,
                                                          in_stack_ffffffffffffe818));
                  (anonymous_namespace)::nMaxConnections = *piVar13;
                  if ((anonymous_namespace)::nMaxConnections < user_max_connection) {
                    _(in_stack_ffffffffffffe868);
                    tinyformat::format<int,int>
                              ((bilingual_str *)
                               CONCAT17(in_stack_ffffffffffffe89f,in_stack_ffffffffffffe898),
                               (int *)in_stack_ffffffffffffe890,(int *)in_stack_ffffffffffffe888);
                    InitWarning((bilingual_str *)
                                CONCAT17(in_stack_ffffffffffffe847,
                                         CONCAT16(in_stack_ffffffffffffe846,
                                                  CONCAT15(in_stack_ffffffffffffe845,
                                                           in_stack_ffffffffffffe840))));
                    bilingual_str::~bilingual_str
                              ((bilingual_str *)
                               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                    bilingual_str::~bilingual_str
                              ((bilingual_str *)
                               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                  }
                  init::SetLoggingCategories(in_stack_ffffffffffffe928);
                  bVar2 = util::Result::operator_cast_to_bool
                                    ((Result<void> *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                  if (!bVar2) {
                    util::ErrorString<void>((Result<void> *)in_stack_ffffffffffffe850);
                    local_1311 = InitError((bilingual_str *)
                                           CONCAT17(in_stack_ffffffffffffe847,
                                                    CONCAT16(in_stack_ffffffffffffe846,
                                                             CONCAT15(in_stack_ffffffffffffe845,
                                                                      in_stack_ffffffffffffe840))));
                    bilingual_str::~bilingual_str
                              ((bilingual_str *)
                               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                  }
                  util::Result<void>::~Result
                            ((Result<void> *)
                             CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                  if (bVar2) {
                    init::SetLoggingLevel(in_stack_ffffffffffffe930);
                    bVar2 = util::Result::operator_cast_to_bool
                                      ((Result<void> *)
                                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818)
                                      );
                    if (!bVar2) {
                      util::ErrorString<void>((Result<void> *)in_stack_ffffffffffffe850);
                      local_1311 = InitError((bilingual_str *)
                                             CONCAT17(in_stack_ffffffffffffe847,
                                                      CONCAT16(in_stack_ffffffffffffe846,
                                                               CONCAT15(in_stack_ffffffffffffe845,
                                                                        in_stack_ffffffffffffe840)))
                                            );
                      bilingual_str::~bilingual_str
                                ((bilingual_str *)
                                 CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                    }
                    util::Result<void>::~Result
                              ((Result<void> *)
                               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                    if (bVar2) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                 (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                      iVar8 = ArgsManager::GetIntArg
                                        ((ArgsManager *)in_stack_ffffffffffffe820,
                                         (string *)
                                         CONCAT44(in_stack_ffffffffffffe81c,
                                                  in_stack_ffffffffffffe818),
                                         (int64_t)in_stack_ffffffffffffe828);
                      nConnectTimeout = (int)iVar8;
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                      std::allocator<char>::~allocator(local_12b9);
                      if (nConnectTimeout < 1) {
                        nConnectTimeout = 5000;
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                 (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                      (anonymous_namespace)::peer_connect_timeout =
                           ArgsManager::GetIntArg
                                     ((ArgsManager *)in_stack_ffffffffffffe820,
                                      (string *)
                                      CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                                      (int64_t)in_stack_ffffffffffffe828);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                      std::allocator<char>::~allocator(&local_12ba);
                      if ((anonymous_namespace)::peer_connect_timeout < 1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                   (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                        Untranslated((string *)in_stack_ffffffffffffe850);
                        local_1311 = InitError((bilingual_str *)
                                               CONCAT17(in_stack_ffffffffffffe847,
                                                        CONCAT16(in_stack_ffffffffffffe846,
                                                                 CONCAT15(in_stack_ffffffffffffe845,
                                                                          in_stack_ffffffffffffe840)
                                                                )));
                        bilingual_str::~bilingual_str
                                  ((bilingual_str *)
                                   CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
                        ;
                        std::allocator<char>::~allocator(&local_12bb);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                   (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                        bVar2 = ArgsManager::IsArgSet
                                          ((ArgsManager *)
                                           CONCAT17(in_stack_ffffffffffffe847,
                                                    CONCAT16(in_stack_ffffffffffffe846,
                                                             CONCAT15(in_stack_ffffffffffffe845,
                                                                      in_stack_ffffffffffffe840))),
                                           in_stack_ffffffffffffe838);
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
                        ;
                        std::allocator<char>::~allocator(&local_12bc);
                        if (bVar2) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                          ArgsManager::GetArg((ArgsManager *)in_stack_ffffffffffffe858._M_current,
                                              (string *)in_stack_ffffffffffffe850,
                                              in_stack_ffffffffffffe848.option);
                          ParseMoney(in_stack_ffffffffffffe8d0);
                          bVar2 = std::optional::operator_cast_to_bool
                                            ((optional<long> *)
                                             CONCAT44(in_stack_ffffffffffffe81c,
                                                      in_stack_ffffffffffffe818));
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818
                                                ));
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818
                                                ));
                          std::allocator<char>::~allocator(&local_12be);
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818
                                                ));
                          std::allocator<char>::~allocator(&local_12bd);
                          if (((bVar2 ^ 0xffU) & 1) != 0) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                       (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                       (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                       (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                            ArgsManager::GetArg((ArgsManager *)in_stack_ffffffffffffe858._M_current,
                                                (string *)in_stack_ffffffffffffe850,
                                                in_stack_ffffffffffffe848.option);
                            common::AmountErrMsg
                                      ((string *)in_stack_ffffffffffffe850,
                                       in_stack_ffffffffffffe848.option);
                            local_1311 = InitError((bilingual_str *)
                                                   CONCAT17(in_stack_ffffffffffffe847,
                                                            CONCAT16(in_stack_ffffffffffffe846,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffe845,
                                                  in_stack_ffffffffffffe840))));
                            bilingual_str::~bilingual_str
                                      ((bilingual_str *)
                                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818)
                                      );
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffe81c,
                                                   in_stack_ffffffffffffe818));
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffe81c,
                                                   in_stack_ffffffffffffe818));
                            std::allocator<char>::~allocator(&local_12c1);
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffe81c,
                                                   in_stack_ffffffffffffe818));
                            std::allocator<char>::~allocator(&local_12c0);
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffe81c,
                                                   in_stack_ffffffffffffe818));
                            std::allocator<char>::~allocator(&local_12bf);
                            goto LAB_00193232;
                          }
                        }
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                   (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                        iVar8 = ArgsManager::GetIntArg
                                          ((ArgsManager *)in_stack_ffffffffffffe820,
                                           (string *)
                                           CONCAT44(in_stack_ffffffffffffe81c,
                                                    in_stack_ffffffffffffe818),
                                           (int64_t)in_stack_ffffffffffffe828);
                        nBytesPerSigOp = (uint)iVar8;
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
                        ;
                        std::allocator<char>::~allocator(&local_12c2);
                        uVar6 = (*g_wallet_init_interface->_vptr_WalletInitInterface[2])();
                        if ((uVar6 & 1) == 0) {
                          local_1311 = 0;
                        }
                        else {
                          args_00 = args;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                          opts = (Options *)
                                 ArgsManager::GetIntArg
                                           ((ArgsManager *)in_stack_ffffffffffffe820,
                                            (string *)
                                            CONCAT44(in_stack_ffffffffffffe81c,
                                                     in_stack_ffffffffffffe818),
                                            (int64_t)in_stack_ffffffffffffe828);
                          SetMockTime(CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
                          ;
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818
                                                ));
                          std::allocator<char>::~allocator(&local_12c3);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                          bVar3 = ArgsManager::GetBoolArg
                                            ((ArgsManager *)in_stack_ffffffffffffe820,
                                             (string *)
                                             CONCAT44(in_stack_ffffffffffffe81c,
                                                      in_stack_ffffffffffffe818),
                                             SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818
                                                ));
                          std::allocator<char>::~allocator((allocator<char> *)(local_12c5 + 1));
                          if ((bVar3 & 1) != 0) {
                            (anonymous_namespace)::nLocalServices =
                                 (anonymous_namespace)::nLocalServices | 4;
                          }
                          this_00 = (ArgsManager *)local_12c5;
                          this = args;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                          bVar2 = ArgsManager::IsArgSet
                                            ((ArgsManager *)
                                             CONCAT17(in_stack_ffffffffffffe847,
                                                      CONCAT16(in_stack_ffffffffffffe846,
                                                               CONCAT15(in_stack_ffffffffffffe845,
                                                                        in_stack_ffffffffffffe840)))
                                             ,in_stack_ffffffffffffe838);
                          uVar6 = (uint)bVar2 << 0x18;
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818
                                                ));
                          std::allocator<char>::~allocator((allocator<char> *)local_12c5);
                          if ((uVar6 & 0x1000000) != 0) {
                            CVar4 = CChainParams::GetChainType
                                              ((CChainParams *)
                                               CONCAT44(in_stack_ffffffffffffe81c,
                                                        in_stack_ffffffffffffe818));
                            if (CVar4 != REGTEST) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                                         (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                              Untranslated((string *)in_stack_ffffffffffffe850);
                              local_1311 = InitError((bilingual_str *)
                                                     CONCAT17(in_stack_ffffffffffffe847,
                                                              CONCAT16(in_stack_ffffffffffffe846,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffe845,
                                                  in_stack_ffffffffffffe840))));
                              bilingual_str::~bilingual_str
                                        ((bilingual_str *)
                                         CONCAT44(in_stack_ffffffffffffe81c,
                                                  in_stack_ffffffffffffe818));
                              std::__cxx11::string::~string
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_ffffffffffffe81c,
                                                     in_stack_ffffffffffffe818));
                              std::allocator<char>::~allocator(&local_12c6);
                              goto LAB_00193232;
                            }
                            str.lit = &local_12e1;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)str.lit,(char *)args,
                                       (allocator<char> *)in_stack_ffffffffffffe858._M_current);
                            ArgsManager::GetArgs(this_00,(string *)this);
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffe81c,
                                                   in_stack_ffffffffffffe818));
                            std::allocator<char>::~allocator((allocator<char> *)&local_12e1);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_ffffffffffffe820);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_ffffffffffffe820);
                            while (bVar2 = __gnu_cxx::
                                           operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                     ((
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffe828,
                                                  (
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffe820),
                                  ((bVar2 ^ 0xffU) & 1) != 0) {
                              __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)CONCAT44(in_stack_ffffffffffffe81c,
                                                      in_stack_ffffffffffffe818));
                              in_stack_ffffffffffffe850 = &TEST_OPTIONS_DOC_abi_cxx11_;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_ffffffffffffe820);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_ffffffffffffe820);
                              in_stack_ffffffffffffe858 =
                                   std::
                                   find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,AppInitParameterInteraction(ArgsManager_const&)::__0>
                                             (in_stack_ffffffffffffe858,
                                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               )in_stack_ffffffffffffe850,in_stack_ffffffffffffe848)
                              ;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_ffffffffffffe820);
                              bVar2 = __gnu_cxx::
                                      operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffe828,
                                                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffe820);
                              if (bVar2) {
                                _(str);
                                tinyformat::format<std::__cxx11::string>
                                          (in_stack_ffffffffffffe878,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffe877,
                                                       in_stack_ffffffffffffe870));
                                InitWarning((bilingual_str *)
                                            CONCAT17(in_stack_ffffffffffffe847,
                                                     CONCAT16(in_stack_ffffffffffffe846,
                                                              CONCAT15(in_stack_ffffffffffffe845,
                                                                       in_stack_ffffffffffffe840))))
                                ;
                                bilingual_str::~bilingual_str
                                          ((bilingual_str *)
                                           CONCAT44(in_stack_ffffffffffffe81c,
                                                    in_stack_ffffffffffffe818));
                                bilingual_str::~bilingual_str
                                          ((bilingual_str *)
                                           CONCAT44(in_stack_ffffffffffffe81c,
                                                    in_stack_ffffffffffffe818));
                              }
                              __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)CONCAT44(in_stack_ffffffffffffe81c,
                                                       in_stack_ffffffffffffe818));
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_ffffffffffffe828);
                          }
                          kernel::Notifications::Notifications
                                    ((Notifications *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                          ArgsManager::GetDataDirNet((ArgsManager *)in_stack_ffffffffffffe820);
                          std::optional<int>::optional
                                    ((optional<int> *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                          std::optional<arith_uint256>::optional
                                    ((optional<arith_uint256> *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                          std::optional<uint256>::optional
                                    ((optional<uint256> *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                          std::chrono::duration<long,std::ratio<1l,1l>>::
                          duration<long,std::ratio<3600l,1l>,void>
                                    ((duration<long,_std::ratio<1L,_1L>_> *)
                                     in_stack_ffffffffffffe820,
                                     (duration<long,_std::ratio<3600L,_1L>_> *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                          node::ApplyArgsManOptions
                                    ((ArgsManager *)CONCAT44(in_stack_ffffffffffffe9ac,iVar5),
                                     (Options *)
                                     CONCAT17(in_stack_ffffffffffffe9a7,in_stack_ffffffffffffe9a0));
                          bVar2 = util::Result::operator_cast_to_bool
                                            ((Result<void> *)
                                             CONCAT44(in_stack_ffffffffffffe81c,
                                                      in_stack_ffffffffffffe818));
                          if (bVar2) {
                            ArgsManager::GetBlocksDirPath(this);
                            node::ApplyArgsManOptions(args_00,opts);
                            bVar2 = util::Result::operator_cast_to_bool
                                              ((Result<void> *)
                                               CONCAT44(in_stack_ffffffffffffe81c,
                                                        in_stack_ffffffffffffe818));
                            if (!bVar2) {
                              util::ErrorString<void>((Result<void> *)in_stack_ffffffffffffe850);
                              local_1311 = InitError((bilingual_str *)
                                                     CONCAT17(in_stack_ffffffffffffe847,
                                                              CONCAT16(in_stack_ffffffffffffe846,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffe845,
                                                  in_stack_ffffffffffffe840))));
                              bilingual_str::~bilingual_str
                                        ((bilingual_str *)
                                         CONCAT44(in_stack_ffffffffffffe81c,
                                                  in_stack_ffffffffffffe818));
                            }
                            bVar2 = !bVar2;
                            util::Result<void>::~Result
                                      ((Result<void> *)
                                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818)
                                      );
                            kernel::BlockManagerOpts::~BlockManagerOpts
                                      ((BlockManagerOpts *)
                                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818)
                                      );
                          }
                          else {
                            util::ErrorString<void>((Result<void> *)in_stack_ffffffffffffe850);
                            local_1311 = InitError((bilingual_str *)
                                                   CONCAT17(in_stack_ffffffffffffe847,
                                                            CONCAT16(in_stack_ffffffffffffe846,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffe845,
                                                  in_stack_ffffffffffffe840))));
                            bilingual_str::~bilingual_str
                                      ((bilingual_str *)
                                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818)
                                      );
                            bVar2 = true;
                          }
                          util::Result<void>::~Result
                                    ((Result<void> *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                          kernel::ChainstateManagerOpts::~ChainstateManagerOpts
                                    ((ChainstateManagerOpts *)
                                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
                          if (!bVar2) {
                            local_1311 = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                         (allocator<char> *)in_stack_ffffffffffffe858._M_current);
              Untranslated((string *)in_stack_ffffffffffffe850);
              local_1311 = InitError((bilingual_str *)
                                     CONCAT17(in_stack_ffffffffffffe847,
                                              CONCAT16(in_stack_ffffffffffffe846,
                                                       CONCAT15(in_stack_ffffffffffffe845,
                                                                in_stack_ffffffffffffe840))));
              bilingual_str::~bilingual_str
                        ((bilingual_str *)
                         CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
              std::allocator<char>::~allocator(&local_129e);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                       (allocator<char> *)in_stack_ffffffffffffe858._M_current);
            Untranslated((string *)in_stack_ffffffffffffe850);
            local_1311 = InitError((bilingual_str *)
                                   CONCAT17(in_stack_ffffffffffffe847,
                                            CONCAT16(in_stack_ffffffffffffe846,
                                                     CONCAT15(in_stack_ffffffffffffe845,
                                                              in_stack_ffffffffffffe840))));
            bilingual_str::~bilingual_str
                      ((bilingual_str *)
                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
            std::allocator<char>::~allocator(&local_129b);
          }
        }
        else {
          _(in_stack_ffffffffffffe868);
          local_1311 = InitError((bilingual_str *)
                                 CONCAT17(in_stack_ffffffffffffe847,
                                          CONCAT16(in_stack_ffffffffffffe846,
                                                   CONCAT15(in_stack_ffffffffffffe845,
                                                            in_stack_ffffffffffffe840))));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
          ;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                   (allocator<char> *)in_stack_ffffffffffffe858._M_current);
        bVar2 = ArgsManager::GetBoolArg
                          ((ArgsManager *)in_stack_ffffffffffffe820,
                           (string *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818),
                           SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
        std::allocator<char>::~allocator(&local_124e);
        if (bVar2) {
          _(in_stack_ffffffffffffe868);
          local_1311 = InitError((bilingual_str *)
                                 CONCAT17(in_stack_ffffffffffffe847,
                                          CONCAT16(in_stack_ffffffffffffe846,
                                                   CONCAT15(in_stack_ffffffffffffe845,
                                                            in_stack_ffffffffffffe840))));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
          ;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                     (allocator<char> *)in_stack_ffffffffffffe858._M_current);
          bVar2 = ArgsManager::GetBoolArg
                            ((ArgsManager *)in_stack_ffffffffffffe820,
                             (string *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818)
                             ,SUB81((ulong)in_stack_ffffffffffffe828 >> 0x38,0));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
          std::allocator<char>::~allocator(&local_124f);
          if (!bVar2) goto LAB_00190c8e;
          _(in_stack_ffffffffffffe868);
          local_1311 = InitError((bilingual_str *)
                                 CONCAT17(in_stack_ffffffffffffe847,
                                          CONCAT16(in_stack_ffffffffffffe846,
                                                   CONCAT15(in_stack_ffffffffffffe845,
                                                            in_stack_ffffffffffffe840))));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
          ;
        }
      }
    }
    else {
      bVar2 = std::operator==(&in_stack_ffffffffffffe828->original,in_stack_ffffffffffffe820);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_00190618;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
                 (allocator<char> *)in_stack_ffffffffffffe858._M_current);
      ArgsManager::GetArgs(in_stack_ffffffffffffe890,(string *)in_stack_ffffffffffffe888);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
      std::allocator<char>::~allocator(&local_1231);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffe820);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe820);
      while (bVar2 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffe828,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffe820), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
        bVar2 = BlockFilterTypeByName
                          (&in_stack_ffffffffffffe830->original,
                           (BlockFilterType *)in_stack_ffffffffffffe828);
        if (!bVar2) {
          _(in_stack_ffffffffffffe868);
          tinyformat::format<std::__cxx11::string>
                    (in_stack_ffffffffffffe878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe877,in_stack_ffffffffffffe870));
          local_1311 = InitError((bilingual_str *)
                                 CONCAT17(in_stack_ffffffffffffe847,
                                          CONCAT16(in_stack_ffffffffffffe846,
                                                   CONCAT15(in_stack_ffffffffffffe845,
                                                            in_stack_ffffffffffffe840))));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
          ;
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818))
          ;
          bVar2 = true;
          goto LAB_001905e4;
        }
        std::set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>::
        insert((set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_> *
               )in_stack_ffffffffffffe828,(value_type *)in_stack_ffffffffffffe820);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
      }
      bVar2 = false;
LAB_001905e4:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffe828);
      if (!bVar2) goto LAB_00190618;
    }
LAB_00193232:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  }
  else {
    _(in_stack_ffffffffffffe868);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
               (allocator<char> *)in_stack_ffffffffffffe858._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe868.lit,in_stack_ffffffffffffe860,
               (allocator<char> *)in_stack_ffffffffffffe858._M_current);
    ArgsManager::GetArg((ArgsManager *)in_stack_ffffffffffffe858._M_current,
                        (string *)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848.option);
    tinyformat::format<std::__cxx11::string>
              (in_stack_ffffffffffffe878,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe877,in_stack_ffffffffffffe870));
    local_1311 = InitError((bilingual_str *)
                           CONCAT17(in_stack_ffffffffffffe847,
                                    CONCAT16(in_stack_ffffffffffffe846,
                                             CONCAT15(in_stack_ffffffffffffe845,
                                                      in_stack_ffffffffffffe840))));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::~allocator(&local_1214);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
    std::allocator<char>::~allocator(&local_1213);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  }
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
LAB_0019326e:
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_ffffffffffffe81c,in_stack_ffffffffffffe818));
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8._M_p) {
    return (bool)(local_1311 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitParameterInteraction(const ArgsManager& args)
{
    const CChainParams& chainparams = Params();
    // ********************************************************* Step 2: parameter interactions

    // also see: InitParameterInteraction()

    // Error if network-specific options (-addnode, -connect, etc) are
    // specified in default section of config file, but not overridden
    // on the command line or in this chain's section of the config file.
    ChainType chain = args.GetChainType();
    if (chain == ChainType::SIGNET) {
        LogPrintf("Signet derived magic (message start): %s\n", HexStr(chainparams.MessageStart()));
    }
    bilingual_str errors;
    for (const auto& arg : args.GetUnsuitableSectionOnlyArgs()) {
        errors += strprintf(_("Config setting for %s only applied on %s network when in [%s] section.") + Untranslated("\n"), arg, ChainTypeToString(chain), ChainTypeToString(chain));
    }

    if (!errors.empty()) {
        return InitError(errors);
    }

    // Testnet3 deprecation warning
    if (chain == ChainType::TESTNET) {
        LogInfo("Warning: Support for testnet3 is deprecated and will be removed in an upcoming release. Consider switching to testnet4.\n");
    }

    // Warn if unrecognized section name are present in the config file.
    bilingual_str warnings;
    for (const auto& section : args.GetUnrecognizedSections()) {
        warnings += strprintf(Untranslated("%s:%i ") + _("Section [%s] is not recognized.") + Untranslated("\n"), section.m_file, section.m_line, section.m_name);
    }

    if (!warnings.empty()) {
        InitWarning(warnings);
    }

    if (!fs::is_directory(args.GetBlocksDirPath())) {
        return InitError(strprintf(_("Specified blocks directory \"%s\" does not exist."), args.GetArg("-blocksdir", "")));
    }

    // parse and validate enabled filter types
    std::string blockfilterindex_value = args.GetArg("-blockfilterindex", DEFAULT_BLOCKFILTERINDEX);
    if (blockfilterindex_value == "" || blockfilterindex_value == "1") {
        g_enabled_filter_types = AllBlockFilterTypes();
    } else if (blockfilterindex_value != "0") {
        const std::vector<std::string> names = args.GetArgs("-blockfilterindex");
        for (const auto& name : names) {
            BlockFilterType filter_type;
            if (!BlockFilterTypeByName(name, filter_type)) {
                return InitError(strprintf(_("Unknown -blockfilterindex value %s."), name));
            }
            g_enabled_filter_types.insert(filter_type);
        }
    }

    // Signal NODE_P2P_V2 if BIP324 v2 transport is enabled.
    if (args.GetBoolArg("-v2transport", DEFAULT_V2_TRANSPORT)) {
        nLocalServices = ServiceFlags(nLocalServices | NODE_P2P_V2);
    }

    // Signal NODE_COMPACT_FILTERS if peerblockfilters and basic filters index are both enabled.
    if (args.GetBoolArg("-peerblockfilters", DEFAULT_PEERBLOCKFILTERS)) {
        if (g_enabled_filter_types.count(BlockFilterType::BASIC) != 1) {
            return InitError(_("Cannot set -peerblockfilters without -blockfilterindex."));
        }

        nLocalServices = ServiceFlags(nLocalServices | NODE_COMPACT_FILTERS);
    }

    if (args.GetIntArg("-prune", 0)) {
        if (args.GetBoolArg("-txindex", DEFAULT_TXINDEX))
            return InitError(_("Prune mode is incompatible with -txindex."));
        if (args.GetBoolArg("-reindex-chainstate", false)) {
            return InitError(_("Prune mode is incompatible with -reindex-chainstate. Use full -reindex instead."));
        }
    }

    // If -forcednsseed is set to true, ensure -dnsseed has not been set to false
    if (args.GetBoolArg("-forcednsseed", DEFAULT_FORCEDNSSEED) && !args.GetBoolArg("-dnsseed", DEFAULT_DNSSEED)){
        return InitError(_("Cannot set -forcednsseed to true when setting -dnsseed to false."));
    }

    // -bind and -whitebind can't be set when not listening
    size_t nUserBind = args.GetArgs("-bind").size() + args.GetArgs("-whitebind").size();
    if (nUserBind != 0 && !args.GetBoolArg("-listen", DEFAULT_LISTEN)) {
        return InitError(Untranslated("Cannot set -bind or -whitebind together with -listen=0"));
    }

    // if listen=0, then disallow listenonion=1
    if (!args.GetBoolArg("-listen", DEFAULT_LISTEN) && args.GetBoolArg("-listenonion", DEFAULT_LISTEN_ONION)) {
        return InitError(Untranslated("Cannot set -listen=0 together with -listenonion=1"));
    }

    // Make sure enough file descriptors are available. We need to reserve enough FDs to account for the bare minimum,
    // plus all manual connections and all bound interfaces. Any remainder will be available for connection sockets

    // Number of bound interfaces (we have at least one)
    int nBind = std::max(nUserBind, size_t(1));
    // Maximum number of connections with other nodes, this accounts for all types of outbounds and inbounds except for manual
    int user_max_connection = args.GetIntArg("-maxconnections", DEFAULT_MAX_PEER_CONNECTIONS);
    if (user_max_connection < 0) {
        return InitError(Untranslated("-maxconnections must be greater or equal than zero"));
    }
    // Reserve enough FDs to account for the bare minimum, plus any manual connections, plus the bound interfaces
    int min_required_fds = MIN_CORE_FDS + MAX_ADDNODE_CONNECTIONS + nBind;

    // Try raising the FD limit to what we need (available_fds may be smaller than the requested amount if this fails)
    available_fds = RaiseFileDescriptorLimit(user_max_connection + min_required_fds);
    // If we are using select instead of poll, our actual limit may be even smaller
#ifndef USE_POLL
    available_fds = std::min(FD_SETSIZE, available_fds);
#endif
    if (available_fds < min_required_fds)
        return InitError(strprintf(_("Not enough file descriptors available. %d available, %d required."), available_fds, min_required_fds));

    // Trim requested connection counts, to fit into system limitations
    nMaxConnections = std::min(available_fds - min_required_fds, user_max_connection);

    if (nMaxConnections < user_max_connection)
        InitWarning(strprintf(_("Reducing -maxconnections from %d to %d, because of system limitations."), user_max_connection, nMaxConnections));

    // ********************************************************* Step 3: parameter-to-internal-flags
    if (auto result{init::SetLoggingCategories(args)}; !result) return InitError(util::ErrorString(result));
    if (auto result{init::SetLoggingLevel(args)}; !result) return InitError(util::ErrorString(result));

    nConnectTimeout = args.GetIntArg("-timeout", DEFAULT_CONNECT_TIMEOUT);
    if (nConnectTimeout <= 0) {
        nConnectTimeout = DEFAULT_CONNECT_TIMEOUT;
    }

    peer_connect_timeout = args.GetIntArg("-peertimeout", DEFAULT_PEER_CONNECT_TIMEOUT);
    if (peer_connect_timeout <= 0) {
        return InitError(Untranslated("peertimeout must be a positive integer."));
    }

    // Sanity check argument for min fee for including tx in block
    // TODO: Harmonize which arguments need sanity checking and where that happens
    if (args.IsArgSet("-blockmintxfee")) {
        if (!ParseMoney(args.GetArg("-blockmintxfee", ""))) {
            return InitError(AmountErrMsg("blockmintxfee", args.GetArg("-blockmintxfee", "")));
        }
    }

    nBytesPerSigOp = args.GetIntArg("-bytespersigop", nBytesPerSigOp);

    if (!g_wallet_init_interface.ParameterInteraction()) return false;

    // Option to startup with mocktime set (used for regression testing):
    SetMockTime(args.GetIntArg("-mocktime", 0)); // SetMockTime(0) is a no-op

    if (args.GetBoolArg("-peerbloomfilters", DEFAULT_PEERBLOOMFILTERS))
        nLocalServices = ServiceFlags(nLocalServices | NODE_BLOOM);

    if (args.IsArgSet("-test")) {
        if (chainparams.GetChainType() != ChainType::REGTEST) {
            return InitError(Untranslated("-test=<option> can only be used with regtest"));
        }
        const std::vector<std::string> options = args.GetArgs("-test");
        for (const std::string& option : options) {
            auto it = std::find_if(TEST_OPTIONS_DOC.begin(), TEST_OPTIONS_DOC.end(), [&option](const std::string& doc_option) {
                size_t pos = doc_option.find(" (");
                return (pos != std::string::npos) && (doc_option.substr(0, pos) == option);
            });
            if (it == TEST_OPTIONS_DOC.end()) {
                InitWarning(strprintf(_("Unrecognised option \"%s\" provided in -test=<option>."), option));
            }
        }
    }

    // Also report errors from parsing before daemonization
    {
        kernel::Notifications notifications{};
        ChainstateManager::Options chainman_opts_dummy{
            .chainparams = chainparams,
            .datadir = args.GetDataDirNet(),
            .notifications = notifications,
        };
        auto chainman_result{ApplyArgsManOptions(args, chainman_opts_dummy)};
        if (!chainman_result) {
            return InitError(util::ErrorString(chainman_result));
        }
        BlockManager::Options blockman_opts_dummy{
            .chainparams = chainman_opts_dummy.chainparams,
            .blocks_dir = args.GetBlocksDirPath(),
            .notifications = chainman_opts_dummy.notifications,
        };
        auto blockman_result{ApplyArgsManOptions(args, blockman_opts_dummy)};
        if (!blockman_result) {
            return InitError(util::ErrorString(blockman_result));
        }
    }

    return true;
}